

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  native_handle_type *pnVar1;
  int iVar2;
  native_handle_type *pnVar3;
  ulong uVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar6;
  string __str;
  int client;
  ServerSocket server;
  ThreadPool<int,_8UL> threadPool;
  ulong *local_158;
  long local_150;
  ulong local_148 [2];
  ulong *local_138;
  long local_130;
  ulong local_128 [2];
  ServerSocket local_118;
  ThreadPool<int,_8UL> local_100;
  
  ServerSocket::ServerSocket(&local_118,0x1f90);
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Listening on port: ","");
  local_158 = local_148;
  std::__cxx11::string::_M_construct((ulong)&local_158,'\x04');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_158,4,0x1f90);
  uVar4 = 0xf;
  if (local_138 != local_128) {
    uVar4 = local_128[0];
  }
  if (uVar4 < (ulong)(local_150 + local_130)) {
    uVar4 = 0xf;
    if (local_158 != local_148) {
      uVar4 = local_148[0];
    }
    if ((ulong)(local_150 + local_130) <= uVar4) {
      pnVar3 = (native_handle_type *)
               std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_138);
      uVar5 = extraout_XMM0_Da_00;
      uVar6 = extraout_XMM0_Db_00;
      goto LAB_0010394e;
    }
  }
  pnVar3 = (native_handle_type *)
           std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_158);
  uVar5 = extraout_XMM0_Da;
  uVar6 = extraout_XMM0_Db;
LAB_0010394e:
  local_100.threads._M_elems[0]._M_id._M_thread = (id)*pnVar3;
  pnVar1 = pnVar3 + 2;
  if (local_100.threads._M_elems[0]._M_id._M_thread == (id)pnVar1) {
    uVar5 = (undefined4)*pnVar1;
    uVar6 = *(undefined4 *)((long)pnVar3 + 0x14);
    local_100.threads._M_elems[2]._M_id._M_thread = (id)*pnVar1;
    local_100.threads._M_elems[3]._M_id._M_thread._0_4_ = (undefined4)pnVar3[3];
    local_100.threads._M_elems[3]._M_id._M_thread._4_4_ = *(undefined4 *)((long)pnVar3 + 0x1c);
    local_100.threads._M_elems[0]._M_id._M_thread = (id)(id)(local_100.threads._M_elems + 2);
  }
  else {
    local_100.threads._M_elems[2]._M_id._M_thread = (id)*pnVar1;
  }
  local_100.threads._M_elems[1]._M_id._M_thread = (id)pnVar3[1];
  *pnVar3 = (native_handle_type)pnVar1;
  pnVar3[1] = 0;
  *(undefined1 *)pnVar1 = 0;
  ServerSocket::log(&local_118,(double)CONCAT44(uVar6,uVar5));
  if (local_100.threads._M_elems[0]._M_id._M_thread != (id)(local_100.threads._M_elems + 2)) {
    operator_delete((void *)local_100.threads._M_elems[0]._M_id._M_thread,
                    (long)local_100.threads._M_elems[2]._M_id._M_thread + 1);
  }
  if (local_158 != local_148) {
    operator_delete(local_158,local_148[0] + 1);
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  ThreadPool<int,8ul>::ThreadPool<void(int,ServerSocket&)>
            ((ThreadPool<int,8ul> *)&local_100,handleConnection,&local_118);
  do {
    do {
      iVar2 = ServerSocket::acceptConnection(&local_118);
      local_138 = (ulong *)CONCAT44(local_138._4_4_,iVar2);
    } while (iVar2 < 0);
    ThreadPool<int,_8UL>::addTask(&local_100,(int *)&local_138);
  } while( true );
}

Assistant:

int main(int argc, char const *argv[])
{
	ServerSocket server(PORT);
    server.log(string("Listening on port: ") + to_string(PORT));

    ThreadPool<int, THREADPOOL_SIZE> threadPool(handleConnection, server);

    while (true)
    {
		int client = server.acceptConnection();
        if (client < 0) continue;

        threadPool.addTask(client);
    }
    
    return 0;
}